

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftrfork.c
# Opt level: O0

FT_Error FT_Raccess_Get_DataOffsets
                   (FT_Library library,FT_Stream stream,FT_Long map_offset,FT_Long rdata_pos,
                   FT_Long tag,FT_Bool sort_by_res_id,FT_Long **offsets,FT_Long *count)

{
  FT_Memory memory_00;
  FT_UInt16 FVar1;
  FT_UInt16 FVar2;
  FT_UInt16 FVar3;
  FT_UInt32 FVar4;
  FT_Pointer __base;
  FT_Long *pFVar5;
  FT_RFork_Ref *ref;
  FT_Long *offsets_internal;
  FT_Long temp;
  FT_Memory memory;
  FT_Long rpos;
  FT_Long tag_internal;
  int subcnt;
  int cnt;
  int j;
  int i;
  FT_Error error;
  FT_Bool sort_by_res_id_local;
  FT_Long tag_local;
  FT_Long rdata_pos_local;
  FT_Long map_offset_local;
  FT_Stream stream_local;
  FT_Library library_local;
  
  memory_00 = library->memory;
  i._3_1_ = sort_by_res_id;
  _error = tag;
  tag_local = rdata_pos;
  rdata_pos_local = map_offset;
  map_offset_local = (FT_Long)stream;
  stream_local = (FT_Stream)library;
  j = FT_Stream_Seek(stream,map_offset);
  if (j != 0) {
    return j;
  }
  FVar1 = FT_Stream_ReadUShort((FT_Stream)map_offset_local,&j);
  if (j != 0) {
    return j;
  }
  if (0xfef < (short)FVar1 + 1) {
    return 8;
  }
  cnt = 0;
  while( true ) {
    if ((short)FVar1 + 1 <= cnt) {
      return 1;
    }
    FVar4 = FT_Stream_ReadULong((FT_Stream)map_offset_local,&j);
    if (j != 0) {
      return j;
    }
    FVar2 = FT_Stream_ReadUShort((FT_Stream)map_offset_local,&j);
    if (j != 0) {
      return j;
    }
    FVar3 = FT_Stream_ReadUShort((FT_Stream)map_offset_local,&j);
    if (j != 0) {
      return j;
    }
    if ((int)FVar4 == _error) break;
    cnt = cnt + 1;
  }
  *count = (long)((short)FVar2 + 1);
  if ((*count < 1) || (0xaa7 < *count)) {
    return 8;
  }
  j = FT_Stream_Seek((FT_Stream)map_offset_local,rdata_pos_local + (short)FVar3);
  if (j != 0) {
    return j;
  }
  __base = ft_mem_qrealloc(memory_00,0x10,0,*count,(void *)0x0,&j);
  if (j != 0) {
    return j;
  }
  subcnt = 0;
  do {
    if (*count <= (long)subcnt) {
      if (i._3_1_ != '\0') {
        qsort(__base,*count,0x10,ft_raccess_sort_ref_by_id);
        for (subcnt = 0; (long)subcnt < *count; subcnt = subcnt + 1) {
        }
      }
      pFVar5 = (FT_Long *)ft_mem_qrealloc(memory_00,8,0,*count,(void *)0x0,&j);
      if (j == 0) {
        for (subcnt = 0; (long)subcnt < *count; subcnt = subcnt + 1) {
          pFVar5[subcnt] = tag_local + *(long *)((long)__base + (long)subcnt * 0x10 + 8);
        }
        *offsets = pFVar5;
        j = 0;
      }
LAB_002e0a08:
      ft_mem_free(memory_00,__base);
      return j;
    }
    FVar1 = FT_Stream_ReadUShort((FT_Stream)map_offset_local,&j);
    *(FT_UInt16 *)((long)__base + (long)subcnt * 0x10) = FVar1;
    if ((j != 0) || (j = FT_Stream_Skip((FT_Stream)map_offset_local,2), j != 0)) goto LAB_002e0a08;
    FVar4 = FT_Stream_ReadULong((FT_Stream)map_offset_local,&j);
    if ((j != 0) || (j = FT_Stream_Skip((FT_Stream)map_offset_local,4), j != 0)) goto LAB_002e0a08;
    if ((long)(int)FVar4 < 0) {
      j = 8;
      goto LAB_002e0a08;
    }
    *(ulong *)((long)__base + (long)subcnt * 0x10 + 8) = (long)(int)FVar4 & 0xffffff;
    subcnt = subcnt + 1;
  } while( true );
}

Assistant:

FT_BASE_DEF( FT_Error )
  FT_Raccess_Get_DataOffsets( FT_Library  library,
                              FT_Stream   stream,
                              FT_Long     map_offset,
                              FT_Long     rdata_pos,
                              FT_Long     tag,
                              FT_Bool     sort_by_res_id,
                              FT_Long   **offsets,
                              FT_Long    *count )
  {
    FT_Error      error;
    int           i, j, cnt, subcnt;
    FT_Long       tag_internal, rpos;
    FT_Memory     memory = library->memory;
    FT_Long       temp;
    FT_Long       *offsets_internal = NULL;
    FT_RFork_Ref  *ref = NULL;


    FT_TRACE3(( "\n" ));
    error = FT_Stream_Seek( stream, (FT_ULong)map_offset );
    if ( error )
      return error;

    if ( FT_READ_SHORT( cnt ) )
      return error;
    cnt++;

    /* `rpos' is a signed 16bit integer offset to resource records; the    */
    /* size of a resource record is 12 bytes.  The map header is 28 bytes, */
    /* and a type list needs 10 bytes or more.  If we assume that the name */
    /* list is empty and we have only a single entry in the type list,     */
    /* there can be at most                                                */
    /*                                                                     */
    /*   (32768 - 28 - 10) / 12 = 2727                                     */
    /*                                                                     */
    /* resources.                                                          */
    /*                                                                     */
    /* A type list starts with a two-byte counter, followed by 10-byte     */
    /* type records.  Assuming that there are no resources, the number of  */
    /* type records can be at most                                         */
    /*                                                                     */
    /*   (32768 - 28 - 2) / 8 = 4079                                       */
    /*                                                                     */
    if ( cnt > 4079 )
      return FT_THROW( Invalid_Table );

    for ( i = 0; i < cnt; i++ )
    {
      if ( FT_READ_LONG( tag_internal ) ||
           FT_READ_SHORT( subcnt )      ||
           FT_READ_SHORT( rpos )        )
        return error;

      FT_TRACE2(( "Resource tags: %c%c%c%c\n",
                  (char)( 0xFF & ( tag_internal >> 24 ) ),
                  (char)( 0xFF & ( tag_internal >> 16 ) ),
                  (char)( 0xFF & ( tag_internal >>  8 ) ),
                  (char)( 0xFF & ( tag_internal >>  0 ) ) ));
      FT_TRACE3(( "             : subcount=%d, suboffset=0x%04lx\n",
                  subcnt, rpos ));

      if ( tag_internal == tag )
      {
        *count = subcnt + 1;
        rpos  += map_offset;

        /* a zero count might be valid in the resource specification, */
        /* however, it is completely useless to us                    */
        if ( *count < 1 || *count > 2727 )
          return FT_THROW( Invalid_Table );

        error = FT_Stream_Seek( stream, (FT_ULong)rpos );
        if ( error )
          return error;

        if ( FT_QNEW_ARRAY( ref, *count ) )
          return error;

        for ( j = 0; j < *count; j++ )
        {
          if ( FT_READ_SHORT( ref[j].res_id ) )
            goto Exit;
          if ( FT_STREAM_SKIP( 2 ) )  /* resource name offset */
            goto Exit;
          if ( FT_READ_LONG( temp ) ) /* attributes (8bit), offset (24bit) */
            goto Exit;
          if ( FT_STREAM_SKIP( 4 ) )  /* mbz */
            goto Exit;

          /*
           * According to Inside Macintosh: More Macintosh Toolbox,
           * "Resource IDs" (1-46), there are some reserved IDs.
           * However, FreeType2 is not a font synthesizer, no need
           * to check the acceptable resource ID.
           */
          if ( temp < 0 )
          {
            error = FT_THROW( Invalid_Table );
            goto Exit;
          }

          ref[j].offset = temp & 0xFFFFFFL;

          FT_TRACE3(( "             [%d]:"
                      " resource_id=0x%04x, offset=0x%08lx\n",
                      j, (FT_UShort)ref[j].res_id, ref[j].offset ));
        }

        if ( sort_by_res_id )
        {
          ft_qsort( ref,
                    (size_t)*count,
                    sizeof ( FT_RFork_Ref ),
                    ft_raccess_sort_ref_by_id );

          FT_TRACE3(( "             -- sort resources by their ids --\n" ));

          for ( j = 0; j < *count; j++ )
            FT_TRACE3(( "             [%d]:"
                        " resource_id=0x%04x, offset=0x%08lx\n",
                        j, ref[j].res_id, ref[j].offset ));
        }

        if ( FT_QNEW_ARRAY( offsets_internal, *count ) )
          goto Exit;

        /* XXX: duplicated reference ID,
         *      gap between reference IDs are acceptable?
         *      further investigation on Apple implementation is needed.
         */
        for ( j = 0; j < *count; j++ )
          offsets_internal[j] = rdata_pos + ref[j].offset;

        *offsets = offsets_internal;
        error    = FT_Err_Ok;

      Exit:
        FT_FREE( ref );
        return error;
      }
    }

    return FT_THROW( Cannot_Open_Resource );
  }